

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
duckdb::InternalException::InternalException<int,unsigned_long,unsigned_long>
          (InternalException *this,string *msg,int params,unsigned_long params_1,
          unsigned_long params_2)

{
  unsigned_long in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  string *in_RDI;
  string local_48 [40];
  undefined4 in_stack_ffffffffffffffe8;
  
  Exception::ConstructMessage<int,unsigned_long,unsigned_long>
            (in_RDI,(int)((ulong)in_RSI >> 0x20),CONCAT44(in_EDX,in_stack_ffffffffffffffe8),in_RCX);
  duckdb::InternalException::InternalException((InternalException *)in_RDI,local_48);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

explicit InternalException(const string &msg, ARGS... params)
	    : InternalException(ConstructMessage(msg, params...)) {
	}